

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O2

UINT8 AudioDrv_Deinit(void **drvStruct)

{
  int *piVar1;
  long lVar2;
  UINT8 UVar3;
  
  if (drvStruct != (void **)0x0) {
    piVar1 = (int *)*drvStruct;
    if (*piVar1 == -1) {
      UVar3 = '!';
    }
    else {
      lVar2 = *(long *)(piVar1 + 2);
      (**(code **)(lVar2 + 0x50))(*(undefined8 *)(piVar1 + 8));
      UVar3 = (**(code **)(lVar2 + 0x40))(*(undefined8 *)(piVar1 + 8));
      if (UVar3 == '\0') {
        *drvStruct = (void *)0x0;
        *piVar1 = -1;
        piVar1[2] = 0;
        piVar1[3] = 0;
        piVar1[8] = 0;
        piVar1[9] = 0;
        piVar1[10] = 0;
        piVar1[0xb] = 0;
        piVar1[0xc] = 0;
        piVar1[0xd] = 0;
        ADrvLst_Clear((ADRV_LIST **)(piVar1 + 0xe));
        OSMutex_Deinit(*(OS_MUTEX **)(piVar1 + 0x10));
        piVar1[0x10] = 0;
        piVar1[0x11] = 0;
        UVar3 = '\0';
      }
    }
    return UVar3;
  }
  return '\0';
}

Assistant:

UINT8 AudioDrv_Deinit(void** drvStruct)
{
	ADRV_INSTANCE* audInst;
	AUDIO_DRV* aDrv;
	UINT8 retVal;
	
	if (drvStruct == NULL)
		return AERR_OK;
	
	audInst = (ADRV_INSTANCE*)(*drvStruct);
	aDrv = audInst->drvStruct;
	if (audInst->ID == ADID_UNUSED)
		return AERR_INVALID_DRV;
	
	retVal = aDrv->Stop(audInst->drvData);	// just in case
	// continue regardless of errors
	retVal = aDrv->Destroy(audInst->drvData);
	if (retVal)
		return retVal;
	
	*drvStruct = NULL;
	audInst->ID = ADID_UNUSED;
	audInst->drvStruct = NULL;
	audInst->drvData = NULL;
	audInst->userParam = NULL;
	audInst->mainCallback = NULL;
	ADrvLst_Clear(&audInst->forwardDrvs);
	OSMutex_Deinit(audInst->hMutex);
	audInst->hMutex = NULL;
	return AERR_OK;
}